

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

ON_Object * __thiscall ON_Viewport::Internal_DeepCopy(ON_Viewport *this)

{
  ON_Object *this_00;
  
  this_00 = (ON_Object *)operator_new(0x248);
  ON_Object::ON_Object(this_00,(ON_Object *)this);
  this_00->_vptr_ON_Object = (_func_int **)&PTR_ClassId_0081c4e8;
  memcpy(this_00 + 1,&this->m_bValidCamera,0x234);
  return this_00;
}

Assistant:

static double len2d( double x, double y )
{
  double d= 0.0;
  double fx = fabs(x);
  double fy = fabs(y);
  if ( fx > fy ) {
    d = fy/fx;
    d = fx*sqrt(1.0+d*d);
  }
  else if ( fy > fx ){
    d = fx/fy;
    d = fy*sqrt(1.0+d*d);
  }
  return d;
}